

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O2

void fs_fields_at_savepoint_names(void *serializer,void *savepoint,char **names)

{
  long lVar1;
  int i;
  long lVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mnames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  ser::Serializer::FieldsAtSavepoint_abi_cxx11_
            (&local_30,(Serializer *)serializer,(Savepoint *)savepoint);
  lVar1 = 0;
  for (lVar2 = 0;
      lVar2 < (int)((ulong)((long)local_30.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_30.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5); lVar2 = lVar2 + 1
      ) {
    strcpy(*(char **)((long)names + lVar1),
           *(char **)((long)&((local_30.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar1 * 4));
    lVar1 = lVar1 + 8;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  return;
}

Assistant:

void fs_fields_at_savepoint_names(void* serializer, void* savepoint, char** names)
{
    const std::vector<std::string> mnames = reinterpret_cast<Serializer*>(serializer)->FieldsAtSavepoint(
        *reinterpret_cast<Savepoint*>(savepoint));

    for (int i = 0; i < (int)mnames.size(); ++i)
        std::strcpy(names[i], mnames[i].c_str());
}